

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O1

void lore_append_movement(textblock *tb,monster_race *race,monster_lore *lore,bitflag *known_flags)

{
  short sVar1;
  wchar_t wVar2;
  uint uVar3;
  _Bool _Var4;
  byte bVar5;
  wchar_t wVar6;
  char *pcVar7;
  uint8_t uVar8;
  ushort uVar9;
  undefined1 *puVar10;
  ulong uVar11;
  bitflag flags [12];
  char local_48 [12];
  bitflag local_3c [12];
  
  if (((tb == (textblock *)0x0) || (race == (monster_race *)0x0)) || (lore == (monster_lore *)0x0))
  {
    __assert_fail("tb && race && lore",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                  ,0x3cc,
                  "void lore_append_movement(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
                 );
  }
  textblock_append(tb,"This");
  create_mon_flag_mask(local_3c,10,0xf);
  flag_inter(local_3c,race->flags,0xc);
  wVar6 = flag_next(local_3c,0xc,1);
  if (wVar6 != L'\0') {
    do {
      pcVar7 = describe_race_flag(wVar6);
      textblock_append_c(tb,'\x0e'," %s",pcVar7);
      wVar6 = flag_next(local_3c,0xc,wVar6 + L'\x01');
    } while (wVar6 != L'\0');
  }
  create_mon_flag_mask(local_3c,9,0xf);
  flag_inter(local_3c,race->flags,0xc);
  wVar6 = flag_next(local_3c,0xc,1);
  if (wVar6 == L'\0') {
    textblock_append_c(tb,'\x0e'," creature");
  }
  else {
    pcVar7 = describe_race_flag(wVar6);
    textblock_append_c(tb,'\x0e'," %s",pcVar7);
  }
  wVar6 = race->level;
  if (wVar6 == L'\0') {
    textblock_append(tb," lives in the town");
  }
  else {
    sVar1 = player->max_depth;
    _Var4 = flag_has_dbg(known_flags,0xc,0xc,"known_flags","RF_FORCE_DEPTH");
    pcVar7 = " is normally found ";
    if (_Var4) {
      pcVar7 = " is found ";
    }
    textblock_append(tb,pcVar7);
    textblock_append(tb,"at a danger level of ");
    uVar8 = '\x0e';
    if (sVar1 < wVar6) {
      uVar8 = '\x04';
    }
    textblock_append_c(tb,uVar8,"%d",(ulong)(uint)race->level);
  }
  textblock_append(tb,", and moves");
  _Var4 = flags_test(known_flags,0xc,0x1d,0x1c,0);
  if (!_Var4) goto LAB_00178440;
  _Var4 = flag_has_dbg(known_flags,0xc,0x1d,"known_flags","RF_RAND_50");
  if ((_Var4) && (_Var4 = flag_has_dbg(known_flags,0xc,0x1c,"known_flags","RF_RAND_25"), _Var4)) {
    pcVar7 = " extremely";
LAB_0017840d:
    textblock_append(tb,pcVar7);
  }
  else {
    _Var4 = flag_has_dbg(known_flags,0xc,0x1d,"known_flags","RF_RAND_50");
    if (_Var4) {
      pcVar7 = " somewhat";
      goto LAB_0017840d;
    }
    _Var4 = flag_has_dbg(known_flags,0xc,0x1c,"known_flags","RF_RAND_25");
    if (_Var4) {
      pcVar7 = " a bit";
      goto LAB_0017840d;
    }
  }
  textblock_append(tb," erratically");
  if (race->speed != L'n') {
    textblock_append(tb,", and");
  }
LAB_00178440:
  textblock_append(tb," ");
  if ((player->opts).opt[0x15] == true) {
    textblock_append(tb,"at ");
    local_48[0] = '\0';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    uVar3 = ((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                   [race->speed] * 10) / 10;
    strnfmt(local_48,8,"%d.%dx",
            (ulong)("\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                    [race->speed] / '\n'),(ulong)(uVar3 + (uVar3 / 5 & 0xfffffffe) * -5 & 0xffff));
    textblock_append_c(tb,'\x0e',"%s",local_48);
    textblock_append(tb," normal speed, which is ");
    uVar3 = ((uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                   [race->speed] * 100) /
            (uint)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
                  [(player->state).speed];
    bVar5 = "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
            [race->speed] /
            "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x03\x03\x03\x03\x03\x03\x03\x03\x04\x04\x04\x04\x04\x05\x05\x05\x05\x06\x06\a\a\b\t\n\v\f\r\x0e\x0f\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1a\x1b\x1c\x1d\x1e\x1f !\"#$$%%&&\'\'((()))***+++,,,,-----...../////0000011111111111111111111"
            [(player->state).speed];
    uVar9 = (short)uVar3 + (short)(uVar3 / 100) * -100;
    if (uVar9 == 0) {
      strnfmt(local_48,8,"%dx",(ulong)bVar5);
    }
    else {
      uVar11 = (ulong)uVar9;
      if (((uint)uVar9 * -0x33333333 >> 1 | (uint)(((uint)uVar9 * -0x33333333 & 1) != 0) << 0x1f) <
          0x1999999a) {
        uVar11 = uVar11 / 10;
        pcVar7 = "%d.%dx";
      }
      else {
        pcVar7 = "%d.%02dx";
      }
      strnfmt(local_48,8,pcVar7,(ulong)bVar5,uVar11);
    }
    wVar6 = (player->state).speed;
    wVar2 = race->speed;
    if (wVar6 == wVar2) {
      pcVar7 = "the same as you";
    }
    else {
      uVar8 = '\r';
      if (wVar6 <= wVar2) {
        uVar8 = (wVar6 < wVar2) + '\x03';
      }
      textblock_append_c(tb,uVar8,"%s",local_48);
      pcVar7 = " your speed";
    }
    textblock_append(tb,pcVar7);
  }
  else {
    if (race->speed == L'n') {
      textblock_append(tb,"at ");
    }
    bVar5 = 0x82;
    puVar10 = lore_describe_speed_lore_speed_description;
    pcVar7 = "erroneously";
    do {
      puVar10 = puVar10 + 0x10;
      if (bVar5 < (byte)race->speed) {
        pcVar7 = *(char **)(puVar10 + -8);
        break;
      }
      bVar5 = *puVar10;
    } while (bVar5 != 0xff);
    textblock_append_c(tb,'\x05',"%s",pcVar7);
  }
  _Var4 = flag_has_dbg(known_flags,0xc,0x1b,"known_flags","RF_NEVER_MOVE");
  if (_Var4) {
    textblock_append(tb,", but ");
    textblock_append_c(tb,'\r',"does not deign to chase intruders");
  }
  textblock_append(tb,".  ");
  return;
}

Assistant:

void lore_append_movement(textblock *tb, const struct monster_race *race,
						  const struct monster_lore *lore,
						  bitflag known_flags[RF_SIZE])
{
	int f;
	bitflag flags[RF_SIZE];

	assert(tb && race && lore);

	textblock_append(tb, "This");

	/* Get adjectives */
	create_mon_flag_mask(flags, RFT_RACE_A, RFT_MAX);
	rf_inter(flags, race->flags);
	for (f = rf_next(flags, FLAG_START); f; f = rf_next(flags, f + 1)) {
		textblock_append_c(tb, COLOUR_L_BLUE, " %s", describe_race_flag(f));
	}

	/* Get noun */
	create_mon_flag_mask(flags, RFT_RACE_N, RFT_MAX);
	rf_inter(flags, race->flags);
	f = rf_next(flags, FLAG_START);
	if (f) {
		textblock_append_c(tb, COLOUR_L_BLUE, " %s", describe_race_flag(f));
	} else {
		textblock_append_c(tb, COLOUR_L_BLUE, " creature");
	}

	/* Describe location */
	if (race->level == 0) {
		textblock_append(tb, " lives in the town");
	} else {
		uint8_t colour = (race->level > player->max_depth) ?
			COLOUR_RED : COLOUR_L_BLUE;

		if (rf_has(known_flags, RF_FORCE_DEPTH))
			textblock_append(tb, " is found ");
		else
			textblock_append(tb, " is normally found ");

		textblock_append(tb, "at a danger level of ");
		textblock_append_c(tb, colour, "%d", race->level);
	}

	textblock_append(tb, ", and moves");

	/* Random-ness */
	if (flags_test(known_flags, RF_SIZE, RF_RAND_50, RF_RAND_25, FLAG_END)) {
		/* Adverb */
		if (rf_has(known_flags, RF_RAND_50) && rf_has(known_flags, RF_RAND_25))
			textblock_append(tb, " extremely");
		else if (rf_has(known_flags, RF_RAND_50))
			textblock_append(tb, " somewhat");
		else if (rf_has(known_flags, RF_RAND_25))
			textblock_append(tb, " a bit");

		/* Adjective */
		textblock_append(tb, " erratically");

		/* Hack -- Occasional conjunction */
		if (race->speed != 110) textblock_append(tb, ", and");
	}

	/* Speed */
	textblock_append(tb, " ");

	if (OPT(player, effective_speed))
		lore_multiplier_speed(tb, race);
	else
		lore_adjective_speed(tb, race);

	/* The speed description also describes "attack speed" */
	if (rf_has(known_flags, RF_NEVER_MOVE)) {
		textblock_append(tb, ", but ");
		textblock_append_c(tb, COLOUR_L_GREEN,
						   "does not deign to chase intruders");
	}

	/* End this sentence */
	textblock_append(tb, ".  ");
}